

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O3

bool __thiscall
llbuild::core::BuildEngine::attachDB
          (BuildEngine *this,
          unique_ptr<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_> *database
          ,string *error_out)

{
  void *pvVar1;
  BuildDB *pBVar2;
  undefined8 uVar3;
  bool success;
  undefined1 local_19;
  
  pvVar1 = this->impl;
  pBVar2 = (database->_M_t).
           super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>
           .super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl;
  (database->_M_t).
  super___uniq_ptr_impl<llbuild::core::BuildDB,_std::default_delete<llbuild::core::BuildDB>_>._M_t.
  super__Tuple_impl<0UL,_llbuild::core::BuildDB_*,_std::default_delete<llbuild::core::BuildDB>_>.
  super__Head_base<0UL,_llbuild::core::BuildDB_*,_false>._M_head_impl = (BuildDB *)0x0;
  if (*(long *)((long)pvVar1 + 0x60) != 0) {
    __assert_fail("!db && \"invalid attachDB() call\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x68b,
                  "bool (anonymous namespace)::BuildEngineImpl::attachDB(std::unique_ptr<BuildDB>, std::string *)"
                 );
  }
  if (*(long *)((long)pvVar1 + 0xc0) == 0) {
    if (*(long *)((long)pvVar1 + 0x1d0) == 0) {
      *(BuildDB **)((long)pvVar1 + 0x60) = pBVar2;
      (*pBVar2->_vptr_BuildDB[2])(pBVar2,pvVar1);
      uVar3 = (**(code **)(**(long **)((long)pvVar1 + 0x60) + 0x18))
                        (*(long **)((long)pvVar1 + 0x60),&local_19,error_out);
      *(undefined8 *)((long)pvVar1 + 0xc0) = uVar3;
      return (bool)local_19;
    }
    __assert_fail("ruleInfos.empty() && \"invalid attachDB() call\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                  ,0x68d,
                  "bool (anonymous namespace)::BuildEngineImpl::attachDB(std::unique_ptr<BuildDB>, std::string *)"
                 );
  }
  __assert_fail("currentEpoch == 0 && \"invalid attachDB() call\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Core/BuildEngine.cpp"
                ,0x68c,
                "bool (anonymous namespace)::BuildEngineImpl::attachDB(std::unique_ptr<BuildDB>, std::string *)"
               );
}

Assistant:

bool BuildEngine::attachDB(std::unique_ptr<BuildDB> database, std::string* error_out) {
  return static_cast<BuildEngineImpl*>(impl)->attachDB(std::move(database), error_out);
}